

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O0

attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1> *
__thiscall
c74::min::
attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>::
operator=(attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
          *this,double arg)

{
  initializer_list<c74::min::atom> __l;
  allocator<c74::min::atom> local_51;
  atom local_50;
  atom *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  atoms as;
  double arg_local;
  attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
  *this_local;
  
  as.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg;
  atom::atom<double,_0>(&local_50,arg);
  local_38 = 1;
  local_40 = &local_50;
  std::allocator<c74::min::atom>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::vector
            ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)local_30,__l,&local_51);
  std::allocator<c74::min::atom>::~allocator(&local_51);
  (**(this->super_attribute_base)._vptr_attribute_base)(this,local_30);
  std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::~vector
            ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)local_30);
  return this;
}

Assistant:

attribute& operator=(const T arg)
    {
        atoms as = { atom(arg) };
        *this = as;
        return *this;
    }